

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O3

void __thiscall Poll::compact(Poll *this)

{
  pointer ppVar1;
  ulong uVar2;
  vector<pollfd,_std::allocator<pollfd>_> new_table;
  value_type fd;
  vector<pollfd,_std::allocator<pollfd>_> local_48;
  pollfd local_28;
  
  local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pollfd *)0x0;
  local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pollfd *)0x0;
  ppVar1 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar1) {
    uVar2 = 0;
    do {
      local_28 = ppVar1[uVar2];
      if (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<pollfd,std::allocator<pollfd>>::_M_realloc_insert<pollfd_const&>
                  ((vector<pollfd,std::allocator<pollfd>> *)&local_48,
                   (iterator)
                   local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_28);
      }
      else {
        *local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
         super__Vector_impl_data._M_finish = local_28;
        local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar2 = uVar2 + 1;
      ppVar1 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3));
  }
  std::vector<pollfd,_std::allocator<pollfd>_>::operator=(&this->fds,&local_48);
  if (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Poll::compact() {
  std::vector<pollfd> new_table;
  for (int i = 0; i < fds.size(); ++i) {
    auto fd = fds[i];
    if (fd.fd != DELETED) {
      new_table.push_back(fd);
    }
  }
  this->fds = new_table;
}